

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O3

void Rwr_MarkUsed_rec(Rwr_Man_t *p,Rwr_Node_t *pNode)

{
  uint uVar1;
  uint *puVar2;
  
  uVar1 = *(uint *)&pNode->field_0xe;
  if ((uVar1 >> 0x1e & 1) == 0) {
    puVar2 = (uint *)&pNode->field_0xe;
    do {
      if (pNode->TravId == p->nTravIds) {
        return;
      }
      pNode->TravId = p->nTravIds;
      *puVar2 = uVar1 | 0x40000000;
      Rwr_MarkUsed_rec(p,(Rwr_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe));
      pNode = (Rwr_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe);
      puVar2 = (uint *)&pNode->field_0xe;
      uVar1 = *(uint *)&pNode->field_0xe;
    } while ((uVar1 >> 0x1e & 1) == 0);
  }
  return;
}

Assistant:

void Rwr_MarkUsed_rec( Rwr_Man_t * p, Rwr_Node_t * pNode )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    pNode->fUsed = 1;
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p0) );
    Rwr_MarkUsed_rec( p, Rwr_Regular(pNode->p1) );
}